

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::QAction(QAction *this,QActionPrivate *dd,QObject *parent)

{
  bool bVar1;
  QActionPrivate *this_00;
  QObject *in_RDX;
  QObjectPrivate *in_RSI;
  QObject *in_RDI;
  QActionPrivate *d;
  QActionGroup *in_stack_00000038;
  QAction *in_stack_00000088;
  
  QObject::QObject(in_RDI,in_RSI,in_RDX);
  *(undefined ***)in_RDI = &PTR_metaObject_00e22288;
  this_00 = d_func((QAction *)0x975396);
  qobject_cast<QActionGroup*>((QObject *)0x9753a5);
  QPointer<QActionGroup>::operator=((QPointer<QActionGroup> *)this_00,(QActionGroup *)in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QActionGroup> *)0x9753c4);
  if (bVar1) {
    QPointer<QActionGroup>::operator->((QPointer<QActionGroup> *)0x9753d8);
    QActionGroup::addAction(in_stack_00000038,in_stack_00000088);
  }
  return;
}

Assistant:

QAction::QAction(QActionPrivate &dd, QObject *parent)
    : QObject(dd, parent)
{
    Q_D(QAction);
    d->group = qobject_cast<QActionGroup *>(parent);
    if (d->group)
        d->group->addAction(this);
}